

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O2

void __thiscall pbrt::ShapeSceneEntity::~ShapeSceneEntity(ShapeSceneEntity *this)

{
  std::__cxx11::string::~string((string *)&this->outsideMedium);
  std::__cxx11::string::~string((string *)&this->insideMedium);
  std::__cxx11::string::~string((string *)&this->materialName);
  SceneEntity::~SceneEntity(&this->super_SceneEntity);
  return;
}

Assistant:

ShapeSceneEntity() = default;